

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

int QObject::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  MethodType MVar2;
  int iVar3;
  undefined4 extraout_var;
  int *piVar4;
  QMetaObject *pQVar5;
  undefined4 extraout_var_00;
  undefined8 uVar6;
  undefined4 extraout_var_01;
  QObject *in_RCX;
  socklen_t __len_00;
  socklen_t __len_01;
  undefined4 in_register_00000014;
  QMetaMethod *this;
  undefined4 in_register_0000003c;
  undefined8 *puVar7;
  QMetaMethod *in_R8;
  int in_R9D;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  long in_FS_OFFSET;
  int method_index;
  int signal_index;
  QByteArray local_88;
  QByteArray local_70;
  int dummy;
  int iStack_54;
  char acStack_50 [16];
  char *local_40;
  long local_38;
  
  puVar7 = (undefined8 *)CONCAT44(in_register_0000003c,__fd);
  this = (QMetaMethod *)CONCAT44(in_register_00000014,__len);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RCX == (QObject *)0x0 || __addr == (sockaddr *)0x0) ||
      (MVar2 = QMetaMethod::methodType(this), MVar2 != Signal)) ||
     (MVar2 = QMetaMethod::methodType(in_R8), MVar2 == Constructor)) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      dummy = 2;
      iStack_54 = 0;
      acStack_50[0] = '\0';
      acStack_50[1] = '\0';
      acStack_50[2] = '\0';
      acStack_50[3] = '\0';
      acStack_50[4] = '\0';
      acStack_50[5] = '\0';
      acStack_50[6] = '\0';
      acStack_50[7] = '\0';
      acStack_50[8] = '\0';
      acStack_50[9] = '\0';
      acStack_50[10] = '\0';
      acStack_50[0xb] = '\0';
      acStack_50[0xc] = '\0';
      acStack_50[0xd] = '\0';
      acStack_50[0xe] = '\0';
      acStack_50[0xf] = '\0';
      local_40 = lcConnect::category.name;
      if (__addr == (sockaddr *)0x0) {
        pcVar9 = "(nullptr)";
      }
      else {
        pQVar5 = (QMetaObject *)(*(code *)**(undefined8 **)__addr)(__addr);
        pcVar9 = QMetaObject::className(pQVar5);
      }
      QMetaMethod::methodSignature(&local_70,this);
      pcVar10 = local_70.d.ptr;
      if (local_70.d.ptr == (char *)0x0) {
        pcVar10 = "";
      }
      if (in_RCX == (QObject *)0x0) {
        pcVar8 = "(nullptr)";
      }
      else {
        iVar3 = (**in_RCX->_vptr_QObject)();
        pcVar8 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var_00,iVar3));
      }
      QMetaMethod::methodSignature(&local_88,in_R8);
      if (local_88.d.ptr == (char *)0x0) {
        local_88.d.ptr = "";
      }
      QMessageLogger::warning
                ((QMessageLogger *)&dummy,"QObject::connect: Cannot connect %s::%s to %s::%s",pcVar9
                 ,pcVar10,pcVar8,local_88.d.ptr);
      connect((int)&local_88,(sockaddr *)&local_70,(socklen_t)&dummy);
    }
    *puVar7 = 0;
    goto LAB_002b7bb6;
  }
  signal_index = -0x55555556;
  method_index = -0x55555556;
  dummy = -0x55555556;
  QMetaObjectPrivate::memberIndexes((QObject *)__addr,this,&signal_index,&dummy);
  QMetaObjectPrivate::memberIndexes(in_RCX,in_R8,&dummy,&method_index);
  pQVar5 = (QMetaObject *)(*(code *)**(undefined8 **)__addr)(__addr);
  iVar3 = (**in_RCX->_vptr_QObject)();
  if (signal_index == -1) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      dummy = 2;
      iStack_54 = 0;
      acStack_50[0] = '\0';
      acStack_50[1] = '\0';
      acStack_50[2] = '\0';
      acStack_50[3] = '\0';
      acStack_50[4] = '\0';
      acStack_50[5] = '\0';
      acStack_50[6] = '\0';
      acStack_50[7] = '\0';
      acStack_50[8] = '\0';
      acStack_50[9] = '\0';
      acStack_50[10] = '\0';
      acStack_50[0xb] = '\0';
      acStack_50[0xc] = '\0';
      acStack_50[0xd] = '\0';
      acStack_50[0xe] = '\0';
      acStack_50[0xf] = '\0';
      local_40 = lcConnect::category.name;
      QMetaMethod::methodSignature(&local_70,this);
      pcVar9 = QMetaObject::className(pQVar5);
      if (local_70.d.ptr == (char *)0x0) {
        local_70.d.ptr = "";
      }
      QMessageLogger::warning
                ((QMessageLogger *)&dummy,
                 "QObject::connect: Can\'t find signal %s on instance of class %s",local_70.d.ptr,
                 pcVar9);
      connect((int)&local_70,(sockaddr *)&dummy,__len_00);
    }
LAB_002b7f3f:
    uVar6 = 0;
  }
  else {
    if (method_index == -1) {
      lcConnect();
      if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
        dummy = 2;
        iStack_54 = 0;
        acStack_50[0] = '\0';
        acStack_50[1] = '\0';
        acStack_50[2] = '\0';
        acStack_50[3] = '\0';
        acStack_50[4] = '\0';
        acStack_50[5] = '\0';
        acStack_50[6] = '\0';
        acStack_50[7] = '\0';
        acStack_50[8] = '\0';
        acStack_50[9] = '\0';
        acStack_50[10] = '\0';
        acStack_50[0xb] = '\0';
        acStack_50[0xc] = '\0';
        acStack_50[0xd] = '\0';
        acStack_50[0xe] = '\0';
        acStack_50[0xf] = '\0';
        local_40 = lcConnect::category.name;
        QMetaMethod::methodSignature(&local_70,in_R8);
        pcVar9 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar3));
        if (local_70.d.ptr == (char *)0x0) {
          local_70.d.ptr = "";
        }
        QMessageLogger::warning
                  ((QMessageLogger *)&dummy,
                   "QObject::connect: Can\'t find method %s on instance of class %s",local_70.d.ptr,
                   pcVar9);
        connect((int)&local_70,(sockaddr *)&dummy,__len_01);
      }
      goto LAB_002b7f3f;
    }
    QMetaMethod::methodSignature((QByteArray *)&dummy,this);
    pcVar9 = (char *)CONCAT44(acStack_50._4_4_,acStack_50._0_4_);
    QMetaMethod::methodSignature(&local_70,in_R8);
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "";
    }
    pcVar10 = local_70.d.ptr;
    if (local_70.d.ptr == (char *)0x0) {
      pcVar10 = "";
    }
    bVar1 = QMetaObject::checkConnectArgs(pcVar9,pcVar10);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,1,0x10);
      }
    }
    piVar4 = (int *)CONCAT44(iStack_54,dummy);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(iStack_54,dummy),1,0x10);
      }
    }
    if (!bVar1) {
      lcConnect();
      if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
        dummy = 2;
        iStack_54 = 0;
        acStack_50[0] = '\0';
        acStack_50[1] = '\0';
        acStack_50[2] = '\0';
        acStack_50[3] = '\0';
        acStack_50[4] = '\0';
        acStack_50[5] = '\0';
        acStack_50[6] = '\0';
        acStack_50[7] = '\0';
        acStack_50[8] = '\0';
        acStack_50[9] = '\0';
        acStack_50[10] = '\0';
        acStack_50[0xb] = '\0';
        acStack_50[0xc] = '\0';
        acStack_50[0xd] = '\0';
        acStack_50[0xe] = '\0';
        acStack_50[0xf] = '\0';
        local_40 = lcConnect::category.name;
        pcVar9 = QMetaObject::className(pQVar5);
        QMetaMethod::methodSignature(&local_70,this);
        if (local_70.d.ptr == (char *)0x0) {
          local_70.d.ptr = "";
        }
        pcVar10 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar3));
        QMetaMethod::methodSignature(&local_88,in_R8);
        if (local_88.d.ptr == (char *)0x0) {
          local_88.d.ptr = "";
        }
        QMessageLogger::warning
                  ((QMessageLogger *)&dummy,
                   "QObject::connect: Incompatible sender/receiver arguments\n        %s::%s --> %s::%s"
                   ,pcVar9,local_70.d.ptr,pcVar10,local_88.d.ptr);
        connect((int)&local_88,(sockaddr *)&local_70,(socklen_t)&dummy);
      }
      goto LAB_002b7f3f;
    }
    if ((in_R9D == 2) && (piVar4 = queuedConnectionTypes(this), piVar4 == (int *)0x0))
    goto LAB_002b7f3f;
    *puVar7 = &DAT_aaaaaaaaaaaaaaaa;
    iVar3 = QMetaObjectPrivate::connect
                      ((int)__addr,(sockaddr *)(ulong)(uint)signal_index,(socklen_t)this->mobj);
    uVar6 = CONCAT44(extraout_var_01,iVar3);
  }
  *puVar7 = uVar6;
LAB_002b7bb6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __fd;
}

Assistant:

QMetaObject::Connection QObject::connect(const QObject *sender, const QMetaMethod &signal,
                                     const QObject *receiver, const QMetaMethod &method,
                                     Qt::ConnectionType type)
{
    if (sender == nullptr
            || receiver == nullptr
            || signal.methodType() != QMetaMethod::Signal
            || method.methodType() == QMetaMethod::Constructor) {
        qCWarning(lcConnect, "QObject::connect: Cannot connect %s::%s to %s::%s",
                  sender ? sender->metaObject()->className() : "(nullptr)",
                  signal.methodSignature().constData(),
                  receiver ? receiver->metaObject()->className() : "(nullptr)",
                  method.methodSignature().constData());
        return QMetaObject::Connection(nullptr);
    }

    int signal_index;
    int method_index;
    {
        int dummy;
        QMetaObjectPrivate::memberIndexes(sender, signal, &signal_index, &dummy);
        QMetaObjectPrivate::memberIndexes(receiver, method, &dummy, &method_index);
    }

    const QMetaObject *smeta = sender->metaObject();
    const QMetaObject *rmeta = receiver->metaObject();
    if (signal_index == -1) {
        qCWarning(lcConnect, "QObject::connect: Can't find signal %s on instance of class %s",
                  signal.methodSignature().constData(), smeta->className());
        return QMetaObject::Connection(nullptr);
    }
    if (method_index == -1) {
        qCWarning(lcConnect, "QObject::connect: Can't find method %s on instance of class %s",
                  method.methodSignature().constData(), rmeta->className());
        return QMetaObject::Connection(nullptr);
    }

    if (!QMetaObject::checkConnectArgs(signal.methodSignature().constData(),
                                       method.methodSignature().constData())) {
        qCWarning(lcConnect,
                  "QObject::connect: Incompatible sender/receiver arguments"
                  "\n        %s::%s --> %s::%s",
                  smeta->className(), signal.methodSignature().constData(), rmeta->className(),
                  method.methodSignature().constData());
        return QMetaObject::Connection(nullptr);
    }

    int *types = nullptr;
    if ((type == Qt::QueuedConnection) && !(types = queuedConnectionTypes(signal)))
        return QMetaObject::Connection(nullptr);

#ifndef QT_NO_DEBUG
    check_and_warn_compat(smeta, signal, rmeta, method);
#endif
    QMetaObject::Connection handle = QMetaObject::Connection(QMetaObjectPrivate::connect(
        sender, signal_index, signal.enclosingMetaObject(), receiver, method_index, nullptr, type, types));
    return handle;
}